

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O2

UChar32 ucase_totitle_63(UChar32 c)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  sbyte sVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  
  if ((uint)c < 0xd800) {
    uVar5 = (uint)c >> 5;
  }
  else if ((uint)c < 0x10000) {
    uVar5 = ((uint)c >> 5) + 0x140;
    if (0xdbff < (uint)c) {
      uVar5 = (uint)c >> 5;
    }
  }
  else {
    uVar6 = 0xd30;
    if ((0x10ffff < (uint)c) || (uVar6 = 0x2f1c, 0xe07ff < (uint)c)) goto LAB_002975c3;
    uVar5 = ((uint)c >> 5 & 0x3f) + (uint)ucase_props_trieIndex[(ulong)((uint)c >> 0xb) + 0x820];
  }
  uVar6 = (ulong)((c & 0x1fU) + (uint)ucase_props_trieIndex[uVar5] * 4);
LAB_002975c3:
  uVar2 = ucase_props_trieIndex[uVar6];
  if ((uVar2 & 8) == 0) {
    if ((uVar2 & 3) == 1) {
      return c + ((int)(short)uVar2 >> 7);
    }
  }
  else {
    lVar1 = (ulong)(uVar2 >> 4) * 2;
    lVar8 = lVar1 + 0x2feef2;
    uVar3 = ucase_props_exceptions[uVar2 >> 4];
    if (((uVar2 & 3) == 1) && ((uVar3 & 0x10) != 0)) {
      uVar6 = (ulong)""[uVar3 & 0xf];
      if ((uVar3 >> 8 & 1) == 0) {
        uVar5 = (uint)*(ushort *)(lVar8 + uVar6 * 2);
      }
      else {
        uVar5 = CONCAT22(*(undefined2 *)(lVar8 + uVar6 * 4),
                         *(undefined2 *)(lVar1 + 0x2feef4 + uVar6 * 4));
      }
      uVar7 = -uVar5;
      if ((uVar3 >> 10 & 1) == 0) {
        uVar7 = uVar5;
      }
      return c + uVar7;
    }
    if ((uVar3 & 8) == 0) {
      if ((uVar3 & 4) == 0) {
        return c;
      }
      sVar4 = 2;
    }
    else {
      sVar4 = 3;
    }
    uVar6 = (ulong)""[(uint)uVar3 & ~(-1 << sVar4)];
    if ((uVar3 >> 8 & 1) == 0) {
      return (UChar32)*(ushort *)(lVar8 + uVar6 * 2);
    }
    c = CONCAT22(*(undefined2 *)(lVar8 + uVar6 * 4),*(undefined2 *)(lVar1 + 0x2feef4 + uVar6 * 4));
  }
  return c;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
ucase_totitle(UChar32 c) {
    uint16_t props=UTRIE2_GET16(&ucase_props_singleton.trie, c);
    if(!UCASE_HAS_EXCEPTION(props)) {
        if(UCASE_GET_TYPE(props)==UCASE_LOWER) {
            c+=UCASE_GET_DELTA(props);
        }
    } else {
        const uint16_t *pe=GET_EXCEPTIONS(&ucase_props_singleton, props);
        uint16_t excWord=*pe++;
        if(HAS_SLOT(excWord, UCASE_EXC_DELTA) && UCASE_GET_TYPE(props)==UCASE_LOWER) {
            int32_t delta;
            GET_SLOT_VALUE(excWord, UCASE_EXC_DELTA, pe, delta);
            return (excWord&UCASE_EXC_DELTA_IS_NEGATIVE)==0 ? c+delta : c-delta;
        }
        int32_t idx;
        if(HAS_SLOT(excWord, UCASE_EXC_TITLE)) {
            idx=UCASE_EXC_TITLE;
        } else if(HAS_SLOT(excWord, UCASE_EXC_UPPER)) {
            idx=UCASE_EXC_UPPER;
        } else {
            return c;
        }
        GET_SLOT_VALUE(excWord, idx, pe, c);
    }
    return c;
}